

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_containers.h
# Opt level: O3

vector<basisu::vector<basisu::image>_> * __thiscall
basisu::vector<basisu::vector<basisu::image>_>::operator=
          (vector<basisu::vector<basisu::image>_> *this,
          vector<basisu::vector<basisu::image>_> *other)

{
  void *pvVar1;
  uint32_t uVar2;
  long lVar3;
  uint uVar4;
  image *piVar5;
  image *this_00;
  vector<basisu::image> *pvVar6;
  uint32_t uVar7;
  vector<basisu::image> *pvVar8;
  
  if (this != other) {
    uVar4 = other->m_size;
    if (this->m_capacity < uVar4) {
      pvVar6 = this->m_p;
      if (pvVar6 != (vector<basisu::image> *)0x0) {
        if ((ulong)this->m_size != 0) {
          pvVar8 = pvVar6 + this->m_size;
          do {
            piVar5 = pvVar6->m_p;
            if (piVar5 != (image *)0x0) {
              uVar4 = pvVar6->m_size;
              if ((ulong)uVar4 != 0) {
                lVar3 = 0;
                do {
                  pvVar1 = *(void **)((long)&(piVar5->m_pixels).m_p + lVar3);
                  if (pvVar1 != (void *)0x0) {
                    free(pvVar1);
                  }
                  lVar3 = lVar3 + 0x20;
                } while ((ulong)uVar4 << 5 != lVar3);
                piVar5 = pvVar6->m_p;
              }
              free(piVar5);
            }
            pvVar6 = pvVar6 + 1;
          } while (pvVar6 != pvVar8);
          pvVar6 = this->m_p;
        }
        free(pvVar6);
        this->m_p = (vector<basisu::image> *)0x0;
        this->m_size = 0;
        this->m_capacity = 0;
        uVar4 = other->m_size;
      }
      elemental_vector::increase_capacity
                ((elemental_vector *)this,uVar4,false,0x10,(object_mover)0x0,false);
    }
    else if ((ulong)this->m_size != 0) {
      pvVar6 = this->m_p;
      pvVar8 = pvVar6 + this->m_size;
      do {
        piVar5 = pvVar6->m_p;
        if (piVar5 != (image *)0x0) {
          uVar4 = pvVar6->m_size;
          if ((ulong)uVar4 != 0) {
            lVar3 = 0;
            do {
              pvVar1 = *(void **)((long)&(piVar5->m_pixels).m_p + lVar3);
              if (pvVar1 != (void *)0x0) {
                free(pvVar1);
              }
              lVar3 = lVar3 + 0x20;
            } while ((ulong)uVar4 << 5 != lVar3);
            piVar5 = pvVar6->m_p;
          }
          free(piVar5);
        }
        pvVar6 = pvVar6 + 1;
      } while (pvVar6 != pvVar8);
      this->m_size = 0;
    }
    uVar2 = other->m_size;
    if (uVar2 == 0) {
      uVar2 = 0;
    }
    else {
      pvVar6 = other->m_p;
      pvVar8 = this->m_p;
      do {
        pvVar8->m_p = (image *)0x0;
        pvVar8->m_size = 0;
        pvVar8->m_capacity = 0;
        elemental_vector::increase_capacity
                  ((elemental_vector *)pvVar8,pvVar6->m_size,false,0x20,
                   vector<basisu::image>::object_mover,false);
        uVar7 = pvVar6->m_size;
        pvVar8->m_size = uVar7;
        if (uVar7 != 0) {
          piVar5 = pvVar6->m_p;
          this_00 = pvVar8->m_p;
          do {
            image::image(this_00,piVar5);
            uVar7 = uVar7 - 1;
            piVar5 = piVar5 + 1;
            this_00 = this_00 + 1;
          } while (uVar7 != 0);
        }
        pvVar8 = pvVar8 + 1;
        pvVar6 = pvVar6 + 1;
        uVar2 = uVar2 - 1;
      } while (uVar2 != 0);
      uVar2 = other->m_size;
    }
    this->m_size = uVar2;
  }
  return this;
}

Assistant:

inline vector& operator= (const vector& other)
      {
         if (this == &other)
            return *this;

         if (m_capacity >= other.m_size)
            resize(0);
         else
         {
            clear();
            increase_capacity(other.m_size, false);
         }

         if (BASISU_IS_BITWISE_COPYABLE(T))
         {
             if ((m_p) && (other.m_p))
                memcpy(m_p, other.m_p, other.m_size * sizeof(T));
         }
         else
         {
            T* pDst = m_p;
            const T* pSrc = other.m_p;
            for (uint32_t i = other.m_size; i > 0; i--)
               construct(pDst++, *pSrc++);
         }

         m_size = other.m_size;

         return *this;
      }